

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O0

void __thiscall IRC_Bot::setCommandAccessLevels(IRC_Bot *this,IRCCommand *in_command)

{
  Config *pCVar1;
  undefined1 local_28 [8];
  anon_class_16_2_306f8aac set_command_access_levels;
  IRCCommand *in_command_local;
  IRC_Bot *this_local;
  
  local_28 = (undefined1  [8])this;
  set_command_access_levels.this = (IRC_Bot *)in_command;
  set_command_access_levels.in_command = in_command;
  pCVar1 = (Config *)Jupiter::IRC::Client::getSecondaryConfigSection();
  setCommandAccessLevels::anon_class_16_2_306f8aac::operator()
            ((anon_class_16_2_306f8aac *)local_28,pCVar1);
  pCVar1 = (Config *)Jupiter::IRC::Client::getPrimaryConfigSection();
  setCommandAccessLevels::anon_class_16_2_306f8aac::operator()
            ((anon_class_16_2_306f8aac *)local_28,pCVar1);
  return;
}

Assistant:

void IRC_Bot::setCommandAccessLevels(IRCCommand *in_command) {
	auto set_command_access_levels = [this, in_command](Jupiter::Config *in_section) {
		if (in_section == nullptr) {
			return;
		}

		Jupiter::Config *section = in_section->getSection("Commands"sv);
		if (section == nullptr) {
			return;
		}

		for (auto& entry : section->getTable()) {
			size_t tmp_index;
			std::string_view tmp_key, tmp_sub_key;
			IRCCommand *command;

			tmp_index = entry.first.find('.');
			if (tmp_index != std::string_view::npos) {
				// non-default access assignment

				tmp_key = std::string_view(entry.first.data(), tmp_index);

				tmp_sub_key = entry.first;
				tmp_sub_key.remove_prefix(tmp_index + 1);

				if (jessilib::starts_withi(tmp_sub_key, "Type."sv)) {
					tmp_sub_key.remove_prefix(5); // strip "Type."

					command = this->getCommand(tmp_key);
					if (command != nullptr && (in_command == nullptr || in_command == command)) {
						command->setAccessLevel(Jupiter::from_string<int>(tmp_sub_key), Jupiter::from_string<int>(entry.second));
					}
				}
				else if (jessilib::starts_withi(tmp_sub_key, "Channel."sv)) {
					tmp_sub_key.remove_prefix(8); // strip "Channel."

					// Assign access level to command (if command exists)
					command = this->getCommand(tmp_key);
					if (command != nullptr && (in_command == nullptr || in_command == command))
						command->setAccessLevel(tmp_sub_key, Jupiter::from_string<int>(entry.second));
				}
			}
			else {
				// Assign access level to command (if command exists)
				command = this->getCommand(entry.first);
				if (command != nullptr && (in_command == nullptr || in_command == command))
					command->setAccessLevel(Jupiter::from_string<int>(entry.second));
			}
		};
	};

	set_command_access_levels(getSecondaryConfigSection());
	set_command_access_levels(getPrimaryConfigSection());
}